

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall
QNetworkRequest::setDecompressedSafetyCheckThreshold(QNetworkRequest *this,qint64 threshold)

{
  QNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->decompressedSafetyCheckThreshold = threshold;
  return;
}

Assistant:

void QNetworkRequest::setDecompressedSafetyCheckThreshold(qint64 threshold)
{
    d->decompressedSafetyCheckThreshold = threshold;
}